

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.hpp
# Opt level: O3

void __thiscall boost::uuids::detail::sha1::get_digest(sha1 *this,digest_type *digest)

{
  uchar uVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  bool bVar5;
  
  sVar3 = this->block_byte_index_;
  this->block_byte_index_ = sVar3 + 1;
  this->block_[sVar3] = 0x80;
  uVar2 = this->block_byte_index_;
  if (uVar2 == 0x40) {
    this->block_byte_index_ = 0;
    process_block(this);
    uVar2 = this->block_byte_index_;
  }
  if (uVar2 < 0x39) {
    uVar4 = 0x38;
    if (uVar2 != 0x38) {
      do {
        this->block_byte_index_ = uVar2 + 1;
        this->block_[uVar2] = '\0';
        uVar4 = this->block_byte_index_;
        uVar2 = uVar4;
      } while (uVar4 < 0x38);
    }
  }
  else {
    do {
      this->block_byte_index_ = uVar2 + 1;
      this->block_[uVar2] = '\0';
      uVar2 = this->block_byte_index_;
      if (uVar2 == 0x40) {
        this->block_byte_index_ = 0;
        process_block(this);
        uVar2 = this->block_byte_index_;
      }
    } while (uVar2 != 0);
    uVar2 = 0;
    do {
      uVar4 = uVar2 + 1;
      this->block_[uVar2] = '\0';
      bVar5 = uVar2 < 0x37;
      uVar2 = uVar4;
    } while (bVar5);
  }
  uVar1 = *(uchar *)((long)&this->bit_count_high + 3);
  this->block_byte_index_ = uVar4 + 1;
  this->block_[uVar4] = uVar1;
  sVar3 = this->block_byte_index_;
  if (sVar3 == 0x40) {
    this->block_byte_index_ = 0;
    process_block(this);
    sVar3 = this->block_byte_index_;
  }
  uVar1 = *(uchar *)((long)&this->bit_count_high + 2);
  this->block_byte_index_ = sVar3 + 1;
  this->block_[sVar3] = uVar1;
  sVar3 = this->block_byte_index_;
  if (sVar3 == 0x40) {
    this->block_byte_index_ = 0;
    process_block(this);
    sVar3 = this->block_byte_index_;
  }
  uVar1 = *(uchar *)((long)&this->bit_count_high + 1);
  this->block_byte_index_ = sVar3 + 1;
  this->block_[sVar3] = uVar1;
  sVar3 = this->block_byte_index_;
  if (sVar3 == 0x40) {
    this->block_byte_index_ = 0;
    process_block(this);
    sVar3 = this->block_byte_index_;
  }
  this->block_byte_index_ = sVar3 + 1;
  this->block_[sVar3] = (uchar)this->bit_count_high;
  sVar3 = this->block_byte_index_;
  if (sVar3 == 0x40) {
    this->block_byte_index_ = 0;
    process_block(this);
    sVar3 = this->block_byte_index_;
  }
  uVar1 = *(uchar *)((long)&this->bit_count_low + 3);
  this->block_byte_index_ = sVar3 + 1;
  this->block_[sVar3] = uVar1;
  sVar3 = this->block_byte_index_;
  if (sVar3 == 0x40) {
    this->block_byte_index_ = 0;
    process_block(this);
    sVar3 = this->block_byte_index_;
  }
  uVar1 = *(uchar *)((long)&this->bit_count_low + 2);
  this->block_byte_index_ = sVar3 + 1;
  this->block_[sVar3] = uVar1;
  sVar3 = this->block_byte_index_;
  if (sVar3 == 0x40) {
    this->block_byte_index_ = 0;
    process_block(this);
    sVar3 = this->block_byte_index_;
  }
  uVar1 = *(uchar *)((long)&this->bit_count_low + 1);
  this->block_byte_index_ = sVar3 + 1;
  this->block_[sVar3] = uVar1;
  sVar3 = this->block_byte_index_;
  if (sVar3 == 0x40) {
    this->block_byte_index_ = 0;
    process_block(this);
    sVar3 = this->block_byte_index_;
  }
  this->block_byte_index_ = sVar3 + 1;
  this->block_[sVar3] = (uchar)this->bit_count_low;
  if (this->block_byte_index_ == 0x40) {
    this->block_byte_index_ = 0;
    process_block(this);
  }
  (*digest)[0] = this->h_[0];
  (*digest)[1] = this->h_[1];
  (*digest)[2] = this->h_[2];
  (*digest)[3] = this->h_[3];
  (*digest)[4] = this->h_[4];
  return;
}

Assistant:

inline void sha1::get_digest(digest_type& digest)
{
    // append the bit '1' to the message
    process_byte_impl(0x80);

    // append k bits '0', where k is the minimum number >= 0
    // such that the resulting message length is congruent to 56 (mod 64)
    // check if there is enough space for padding and bit_count
    if (block_byte_index_ > 56) {
        // finish this block
        while (block_byte_index_ != 0) {
            process_byte_impl(0);
        }

        // one more block
        while (block_byte_index_ < 56) {
            process_byte_impl(0);
        }
    } else {
        while (block_byte_index_ < 56) {
            process_byte_impl(0);
        }
    }

    // append length of message (before pre-processing)
    // as a 64-bit big-endian integer
    process_byte_impl( static_cast<unsigned char>((bit_count_high>>24) & 0xFF) );
    process_byte_impl( static_cast<unsigned char>((bit_count_high>>16) & 0xFF) );
    process_byte_impl( static_cast<unsigned char>((bit_count_high>>8 ) & 0xFF) );
    process_byte_impl( static_cast<unsigned char>((bit_count_high)     & 0xFF) );
    process_byte_impl( static_cast<unsigned char>((bit_count_low>>24) & 0xFF) );
    process_byte_impl( static_cast<unsigned char>((bit_count_low>>16) & 0xFF) );
    process_byte_impl( static_cast<unsigned char>((bit_count_low>>8 ) & 0xFF) );
    process_byte_impl( static_cast<unsigned char>((bit_count_low)     & 0xFF) );

    // get final digest
    digest[0] = h_[0];
    digest[1] = h_[1];
    digest[2] = h_[2];
    digest[3] = h_[3];
    digest[4] = h_[4];
}